

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::ValidateSymbolName
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_1c) {
      return true;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    if (((((*pcVar2 != '.') &&
          (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 != '_')) &&
         ((pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 < '0' ||
          (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), '9' < *pcVar2)))) &&
        ((pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 < 'A' ||
         (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), 'Z' < *pcVar2)))) &&
       ((pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 < 'a' ||
        (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), 'z' < *pcVar2)))) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::ValidateSymbolName(
    const std::string& name) {
  for (int i = 0; i < name.size(); i++) {
    // I don't trust ctype.h due to locales.  :(
    if (name[i] != '.' && name[i] != '_' && (name[i] < '0' || name[i] > '9') &&
        (name[i] < 'A' || name[i] > 'Z') && (name[i] < 'a' || name[i] > 'z')) {
      return false;
    }
  }
  return true;
}